

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O3

int main(void)

{
  _Rb_tree_color _Var1;
  pointer piVar2;
  iterator __position;
  _Base_ptr p_Var3;
  istream *piVar4;
  vector<int,std::allocator<int>> *pvVar5;
  mapped_type *pmVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  int iVar11;
  uint uVar12;
  int y;
  int q;
  int seq;
  int x;
  int op;
  int n;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dyn;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(piVar4,&local_74);
  if (0 < local_74) {
    uVar12 = 0;
    iVar11 = 0;
    do {
      piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_68);
      piVar4 = (istream *)std::istream::operator>>(piVar4,(int *)&local_6c);
      std::istream::operator>>(piVar4,&local_7c);
      local_70 = (int)(local_6c ^ uVar12) % local_64;
      if (local_68 == 1) {
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &local_60._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var9 = p_Var10;
            p_Var8 = p_Var3;
            _Var1 = p_Var8[1]._M_color;
            p_Var10 = p_Var8;
            if ((int)_Var1 < local_70) {
              p_Var10 = p_Var9;
            }
            p_Var3 = (&p_Var8->_M_left)[(int)_Var1 < local_70];
          } while ((&p_Var8->_M_left)[(int)_Var1 < local_70] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var10 != &local_60._M_impl.super__Rb_tree_header) {
            if ((int)_Var1 < local_70) {
              p_Var8 = p_Var9;
            }
            if ((int)p_Var8[1]._M_color <= local_70) {
              pvVar5 = (vector<int,std::allocator<int>> *)
                       std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                     *)&local_60,&local_70);
              __position._M_current = *(int **)(pvVar5 + 8);
              if (__position._M_current == *(int **)(pvVar5 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (pvVar5,__position,&local_7c);
              }
              else {
                *__position._M_current = local_7c;
                *(int **)(pvVar5 + 8) = __position._M_current + 1;
              }
              goto LAB_00101439;
            }
          }
        }
        local_78 = local_7c;
        pvVar5 = (vector<int,std::allocator<int>> *)
                 std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&local_60,&local_70);
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>(pvVar5,&local_78,&local_74);
      }
      else {
        pmVar6 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&local_60,&local_70);
        piVar2 = (pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = piVar2[(ulong)(long)local_7c %
                        (ulong)((long)(pmVar6->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2)
                       ];
        plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar12);
        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
        std::ostream::put((char)plVar7);
        std::ostream::flush();
      }
LAB_00101439:
      iVar11 = iVar11 + 1;
    } while (iVar11 < local_74);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return 0;
}

Assistant:

int main() {
  std::map<int, std::vector<int>> dyn;
  int n, q, op, x, y, seq, last_answer = 0;
  std::cin >> n >> q;
  for (int i = 0; i < q; ++i) {
    std::cin >> op >> x >> y;
    seq = (x ^ last_answer) % n;
    if (op == 1) {
      if (dyn.find(seq) == dyn.end()) {
        dyn[seq] = {y};
      } else {
        dyn[seq].push_back(y);
      }
    } else {
      const auto &s = dyn[seq];
      last_answer = s[y % s.size()];
      std::cout << last_answer << std::endl;
    }
  }
}